

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsglval(prscxdef *ctx,int typ,prsndef *n)

{
  char cVar1;
  ushort uVar2;
  long lVar3;
  prsndef *ppVar4;
  bool bVar5;
  uint uVar6;
  int *in_RDX;
  int in_ESI;
  prsndef *in_RDI;
  prscxdef *unaff_retaddr;
  prpnum prop;
  int direct_prop;
  int base_opc;
  prsndef *n1;
  int styp;
  int lclnum;
  uchar op2;
  uchar op;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  ushort in_stack_ffffffffffffffbe;
  ushort bytes;
  int iVar7;
  undefined2 in_stack_ffffffffffffffc4;
  ushort in_stack_ffffffffffffffc6;
  byte local_34;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  uchar uVar8;
  byte bVar9;
  int iVar10;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI - 0x96U < 9) {
    bVar9 = prsglcvt[in_ESI + -0x96] | 0xc0;
    uVar8 = '\0';
  }
  else {
    bVar9 = 0xdc;
    uVar8 = prsglcvt_ext[in_ESI + -0x9f];
  }
  iVar7 = in_RDX[1];
  if (iVar7 == 0) {
    if (in_RDX[2] == 0x38) {
      if ((undefined1  [112])((undefined1  [112])in_RDI[1].prsnv & (undefined1  [112])0x20) !=
          (undefined1  [112])0x0) {
        errsigf((errcxdef *)
                ((ulong)CONCAT22(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4) << 0x20),
                (char *)CONCAT26(in_stack_ffffffffffffffbe,
                                 CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),0);
      }
      cVar1 = (char)in_RDX[0x12];
      if (cVar1 == '\x04') {
        emtres((emtcxdef *)
               ((ulong)CONCAT22(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4) << 0x20),
               in_stack_ffffffffffffffbe);
        ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
        uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
        *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
        *(byte *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = bVar9;
        if (uVar8 != '\0') {
          emtres((emtcxdef *)
                 CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),
                 in_stack_ffffffffffffffbe);
          ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
          uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
          *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
          *(uchar *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = uVar8;
        }
        uVar6 = (uint)*(ushort *)((long)in_RDX + 0x4a);
        emtres((emtcxdef *)
               CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),
               in_stack_ffffffffffffffbe);
        oswp2((void *)((long)&((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2]->prsntyp +
                      (long)(int)(uint)*(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10)),
              uVar6);
        *(short *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) =
             *(short *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) + 2;
      }
      else if (cVar1 == '\x03') {
        if ((undefined1  [112])((undefined1  [112])in_RDI[1].prsnv & (undefined1  [112])0x40) !=
            (undefined1  [112])0x0) {
          errlogf((errcxdef *)
                  ((ulong)CONCAT22(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4) << 0x20),
                  (char *)CONCAT26(in_stack_ffffffffffffffbe,
                                   CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),0)
          ;
        }
        emtres((emtcxdef *)
               CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),
               in_stack_ffffffffffffffbe);
        ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
        uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
        *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
        *(undefined1 *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = 0x1c;
        emtres((emtcxdef *)
               CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),
               in_stack_ffffffffffffffbe);
        ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
        uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
        *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
        *(byte *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = bVar9 | 1;
        if (uVar8 != '\0') {
          emtres((emtcxdef *)
                 CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),
                 in_stack_ffffffffffffffbe);
          ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
          uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
          *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
          *(uchar *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = uVar8;
        }
        uVar6 = (uint)*(ushort *)((long)in_RDX + 0x4a);
        emtres((emtcxdef *)
               CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),
               in_stack_ffffffffffffffbe);
        oswp2((void *)((long)&((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2]->prsntyp +
                      (long)(int)(uint)*(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10)),
              uVar6);
        *(short *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) =
             *(short *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) + 2;
      }
      else {
        if (cVar1 == '\x0e') {
          errsigf((errcxdef *)
                  ((ulong)CONCAT22(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4) << 0x20),
                  (char *)CONCAT26(in_stack_ffffffffffffffbe,
                                   CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),0)
          ;
        }
        errlogf((errcxdef *)
                ((ulong)CONCAT22(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4) << 0x20),
                (char *)CONCAT26(in_stack_ffffffffffffffbe,
                                 CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),0);
      }
    }
    else {
      errlogf((errcxdef *)
              ((ulong)CONCAT22(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4) << 0x20),
              (char *)CONCAT26(in_stack_ffffffffffffffbe,
                               CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),0);
    }
  }
  else if (iVar7 == 2) {
    iVar10 = *in_RDX;
    bytes = (ushort)((uint)iVar10 >> 0x10);
    if (iVar10 == 0x3a) {
      prsgexp(unaff_retaddr,in_RDI);
      iVar10 = (int)((ulong)in_RDX >> 0x20);
      prsgexp(unaff_retaddr,in_RDI);
      emtres((emtcxdef *)
             CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),bytes);
      ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
      uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
      *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
      *(byte *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = bVar9 | 2;
      if (uVar8 != '\0') {
        emtres((emtcxdef *)
               CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),bytes);
        ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
        uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
        *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
        *(uchar *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = uVar8;
      }
      prsglval((prscxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),iVar10,
               (prsndef *)
               CONCAT17(bVar9,CONCAT16(uVar8,CONCAT24(in_stack_ffffffffffffffe4,
                                                      in_stack_ffffffffffffffe0))));
    }
    else if (iVar10 == 0x40) {
      lVar3 = *(long *)(in_RDX + 4);
      prsgexp(unaff_retaddr,in_RDI);
      if ((*(int *)(lVar3 + 4) == 0) && (*(int *)(lVar3 + 8) == 0x55)) {
        bVar5 = true;
        local_34 = 1;
        in_stack_ffffffffffffffc6 = *(ushort *)(lVar3 + 0x18);
      }
      else {
        bVar5 = false;
        local_34 = 3;
        prsgexp(unaff_retaddr,in_RDI);
      }
      emtres((emtcxdef *)
             CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),bytes);
      ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
      uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
      *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
      *(byte *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = bVar9 | local_34;
      if (uVar8 != '\0') {
        emtres((emtcxdef *)
               CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),bytes);
        ppVar4 = ((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2];
        uVar2 = *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10);
        *(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) = uVar2 + 1;
        *(uchar *)((long)&ppVar4->prsntyp + (long)(int)(uint)uVar2) = uVar8;
      }
      if (bVar5) {
        emtres((emtcxdef *)
               CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),bytes);
        oswp2((void *)((long)&((in_RDI->prsnv).prsnvn[4]->prsnv).prsnvn[2]->prsntyp +
                      (long)(int)(uint)*(ushort *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10)),
              (uint)in_stack_ffffffffffffffc6);
        *(short *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) =
             *(short *)((long)&(in_RDI->prsnv).prsnvn[4]->prsnv + 10) + 2;
      }
    }
    else {
      errlogf((errcxdef *)CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,2)),
              (char *)CONCAT26(bytes,CONCAT24((short)iVar10,in_stack_ffffffffffffffb8)),0);
    }
  }
  else {
    errlogf((errcxdef *)
            CONCAT26(in_stack_ffffffffffffffc6,CONCAT24(in_stack_ffffffffffffffc4,iVar7)),
            (char *)CONCAT26(in_stack_ffffffffffffffbe,
                             CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),0);
  }
  return;
}

Assistant:

static void prsglval(prscxdef *ctx, int typ, prsndef *n)
{
    uchar op;
    uchar op2;

    if (typ - TOKTINC < sizeof(prsglcvt)/sizeof(prsglcvt[0]))
    {
        op = OPCASI_MASK | prsglcvt[typ - TOKTINC];   /* form basic op code */
        op2 = 0;
    }
    else
    {
        op = OPCASI_MASK | OPCASIEXT;
        op2 = prsglcvt_ext[typ - TOKTMODEQ];
    }
    
    switch(n->prsnnlf)
    {
    case 0:
        {
            int lclnum;
            int styp;

            /* DON'T assume this is a 'self.' property if unknown */
            /* DON'T prsdef(ctx, &n->prsnv.prsnvt, TOKSTPROP); */

            if (n->prsnv.prsnvt.toktyp == TOKTSYMBOL)
            {
                if (ctx->prscxflg & PRSCXFWTCH)
                    errsig(ctx->prscxerr, ERR_WTCHLCL);

                if ((styp = n->prsnv.prsnvt.toksym.tokstyp) == TOKSTLOCAL)
                {
                    emtop(ctx->prscxemt, op | OPCASILCL);
                    if (op2) emtop(ctx->prscxemt, op2);
                    lclnum = n->prsnv.prsnvt.toksym.toksval;
                    emtint2(ctx->prscxemt, lclnum);
                }
                else if (styp == TOKSTPROP)
                {
                    if (ctx->prscxflg & PRSCXFFUNC)
                        errlog(ctx->prscxerr, ERR_NOSELF);
                    
                    emtop(ctx->prscxemt, OPCPUSHSELF);
                    emtop(ctx->prscxemt, op | OPCASIPRP);
                    if (op2) emtop(ctx->prscxemt, op2);
                    lclnum = n->prsnv.prsnvt.toksym.toksval;
                    emtint2(ctx->prscxemt, lclnum);
                }
                else if (styp == TOKSTPROPSPEC)
                    errsig(ctx->prscxerr, ERR_BADSPECEXPR);
                else
                    errlog(ctx->prscxerr, ERR_INVASI);
            }
            else
                errlog(ctx->prscxerr, ERR_INVASI);
        }
        break;
        
    case 2:
        switch(n->prsntyp)
        {
        case TOKTDOT:
            {
                prsndef *n1 = n->prsnv.prsnvn[1];
                int      base_opc;
                int      direct_prop;
                prpnum   prop;
                    
                /* generate the expression providing the object */
                prsgexp(ctx, n->prsnv.prsnvn[0]);

                /* determine the correct base opcode */
                if (n1->prsnnlf == 0 && n1->prsnv.prsnvt.toktyp == TOKTPOUND)
                {

                    /* simple property assignment */
                    direct_prop = TRUE;
                    base_opc = OPCASIPRP;

                    /* remember the property id */
                    prop = n1->prsnv.prsnvt.tokofs;
                }
                else
                {
                    /* assignment through property pointer */
                    direct_prop = FALSE;
                    base_opc = OPCASIPRPPTR;

                    /* generate the property pointer expression */
                    prsgexp(ctx, n1);
                }

                /* generate the appropriate property assignment opcode */
                emtop(ctx->prscxemt, op | base_opc);
                if (op2) emtop(ctx->prscxemt, op2);

                /* if it's a simple assignment, add the property code */
                if (direct_prop) emtint2(ctx->prscxemt, prop);

                break;
            }
            
        case TOKTLBRACK:
            prsgexp(ctx, n->prsnv.prsnvn[0]);             /* evaluate list  */
            prsgexp(ctx, n->prsnv.prsnvn[1]);             /* evaluate index */
            emtop(ctx->prscxemt, op | OPCASIIND);
            if (op2) emtop(ctx->prscxemt, op2);
            prsglval(ctx, TOKTASSIGN, n->prsnv.prsnvn[0]);      /* set list */
            break;
            
        default:
            errlog(ctx->prscxerr, ERR_INVASI);
        }
        break;
        
    default:
        errlog(ctx->prscxerr, ERR_INVASI);
    }
}